

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeFactory.hpp
# Opt level: O0

LatticeFactory * OpenMD::LatticeFactory::getInstance(void)

{
  int iVar1;
  
  if (getInstance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&getInstance()::instance);
    if (iVar1 != 0) {
      memset(&getInstance::instance,0,0x30);
      LatticeFactory((LatticeFactory *)0x1ef84a);
      __cxa_atexit(~LatticeFactory,&getInstance::instance,&__dso_handle);
      __cxa_guard_release(&getInstance()::instance);
    }
  }
  return &getInstance::instance;
}

Assistant:

static LatticeFactory& getInstance() {
      static LatticeFactory instance {};
      return instance;
    }